

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferWriteTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::BasicBufferDataCase::iterate(BasicBufferDataCase *this)

{
  GLenum target;
  int iVar1;
  RenderContext *renderCtx;
  deUint32 dVar2;
  uint uVar3;
  char *pcVar4;
  TestLog *log;
  deUint8 *pdVar5;
  deUint32 buf;
  bool isOk;
  undefined1 local_38 [8];
  ReferenceBuffer refBuf;
  BufferVerifier verifier;
  deUint32 dataSeed;
  BasicBufferDataCase *this_local;
  
  pcVar4 = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(pcVar4);
  renderCtx = (this->super_BufferCase).m_renderCtx;
  log = tcu::TestContext::getLog((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx);
  deqp::gls::BufferTestUtil::BufferVerifier::BufferVerifier
            ((BufferVerifier *)
             &refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,renderCtx,log,this->m_verify);
  deqp::gls::BufferTestUtil::ReferenceBuffer::ReferenceBuffer((ReferenceBuffer *)local_38);
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize((ReferenceBuffer *)local_38,this->m_size);
  pdVar5 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
  deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar5,this->m_size,dVar2 ^ 0x125);
  dVar2 = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_target,dVar2);
  target = this->m_target;
  iVar1 = this->m_size;
  pdVar5 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BufferCase).super_CallLogWrapper,target,(long)iVar1,pdVar5,this->m_usage)
  ;
  deqp::gls::BufferTestUtil::BufferCase::checkError(&this->super_BufferCase);
  pdVar5 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
  uVar3 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                    ((BufferVerifier *)
                     &refBuf.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(EVP_PKEY_CTX *)(ulong)dVar2,pdVar5,
                     0,(uchar *)(ulong)(uint)this->m_size,(ulong)this->m_target);
  deqp::gls::BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,dVar2);
  pcVar4 = "Buffer verification failed";
  if ((uVar3 & 1) != 0) {
    pcVar4 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~((byte)uVar3 & 1) & QP_TEST_RESULT_FAIL,pcVar4);
  deqp::gls::BufferTestUtil::ReferenceBuffer::~ReferenceBuffer((ReferenceBuffer *)local_38);
  deqp::gls::BufferTestUtil::BufferVerifier::~BufferVerifier
            ((BufferVerifier *)
             &refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const deUint32			dataSeed	= deStringHash(getName()) ^ 0x125;
		BufferVerifier			verifier	(m_renderCtx, m_testCtx.getLog(), m_verify);
		ReferenceBuffer			refBuf;
		bool					isOk		= false;

		refBuf.setSize(m_size);
		fillWithRandomBytes(refBuf.getPtr(), m_size, dataSeed);

		deUint32 buf = genBuffer();
		glBindBuffer(m_target, buf);
		glBufferData(m_target, m_size, refBuf.getPtr(), m_usage);

		checkError();

		isOk = verifier.verify(buf, refBuf.getPtr(), 0, m_size, m_target);

		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}